

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int target_width,int target_height,
                Allocator *allocator)

{
  uint uVar1;
  uint in_EDX;
  Mat *in_RDI;
  int type_from;
  int in_stack_00000148;
  int in_stack_0000014c;
  int in_stack_00000150;
  int in_stack_00000154;
  uchar *in_stack_00000158;
  int in_stack_00000170;
  int in_stack_00000178;
  Allocator *in_stack_00000180;
  
  uVar1 = in_EDX & 0xffff;
  if ((uVar1 == 1) || (uVar1 == 2)) {
    from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                       in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
  }
  else if (uVar1 == 3) {
    from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                       in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
  }
  else if ((uVar1 == 4) || (uVar1 == 5)) {
    from_pixels_resize(in_stack_00000158,in_stack_00000154,in_stack_00000150,in_stack_0000014c,
                       in_stack_00000148,in_stack_00000170,in_stack_00000178,in_stack_00000180);
  }
  else {
    fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
    fprintf(_stderr,"\n");
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int target_width, int target_height, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 3, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 1, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return Mat::from_pixels_resize(pixels, type, w, h, w * 4, target_width, target_height, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}